

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::ResolveTextureSubresource
          (DeviceContextVkImpl *this,ITexture *pSrcTexture,ITexture *pDstTexture,
          ResolveTextureSubresourceAttribs *ResolveAttribs)

{
  undefined4 MipLevel;
  undefined4 uVar1;
  TextureFormatAttribs *pTVar2;
  string msg;
  undefined1 local_a0 [40];
  undefined8 local_78;
  undefined8 uStack_70;
  VkExtent3D local_68;
  VkExtent3D local_58;
  uint32_t local_48;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::ResolveTextureSubresource
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pSrcTexture,pDstTexture,
             ResolveAttribs);
  if (pSrcTexture != (ITexture *)0x0) {
    CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>(pSrcTexture);
  }
  if (pDstTexture != (ITexture *)0x0) {
    CheckDynamicType<Diligent::TextureVkImpl,Diligent::ITexture>(pDstTexture);
  }
  if (*(short *)&pSrcTexture[6].super_IDeviceObject.super_IObject._vptr_IObject !=
      *(short *)&pDstTexture[6].super_IDeviceObject.super_IObject._vptr_IObject) {
    FormatString<char[104]>
              ((string *)local_a0,
               (char (*) [104])
               "Vulkan requires that source and destination textures of a resolve operation have the same format (18.6)"
              );
    DebugAssertionFailed
              ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd86);
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                      CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
    }
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyTextureState
            (this,(TextureVkImpl *)pSrcTexture,ResolveAttribs->SrcTextureTransitionMode,
             RESOURCE_STATE_RESOLVE_SOURCE,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");
  TransitionOrVerifyTextureState
            (this,(TextureVkImpl *)pDstTexture,ResolveAttribs->DstTextureTransitionMode,
             RESOURCE_STATE_RESOLVE_DEST,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");
  pTVar2 = GetTextureFormatAttribs
                     (*(TEXTURE_FORMAT *)
                       &pSrcTexture[6].super_IDeviceObject.super_IObject._vptr_IObject);
  if ((byte)(pTVar2->ComponentType - COMPONENT_TYPE_DEPTH) < 2) {
    FormatString<char[55]>
              ((string *)local_a0,
               (char (*) [55])"Vulkan only allows resolve operation for color formats");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd94);
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                      CONCAT44(local_a0._20_4_,local_a0._16_4_) + 1);
    }
  }
  MipLevel = ResolveAttribs->SrcMipLevel;
  uVar1 = ResolveAttribs->SrcSlice;
  local_a0._0_4_ = 1;
  local_a0._32_4_ = ResolveAttribs->DstMipLevel;
  local_a0._36_4_ = ResolveAttribs->DstSlice;
  local_a0._28_4_ = 1;
  local_a0._12_4_ = 1;
  local_a0._16_4_ = 0;
  local_a0._20_4_ = 0;
  local_a0._24_4_ = 0;
  local_78._0_4_ = 1;
  local_78._4_4_ = 0;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_a0._4_4_ = MipLevel;
  local_a0._8_4_ = uVar1;
  GetMipLevelProperties((MipLevelProperties *)&local_58,(TextureDesc *)(pSrcTexture + 3),MipLevel);
  local_68.width = local_58.width;
  local_68.height = local_58.height;
  local_68.depth = local_48;
  VulkanUtilities::VulkanCommandBuffer::ResolveImage
            (&this->m_CommandBuffer,
             (VkImage)pSrcTexture[0x16].super_IDeviceObject.super_IObject._vptr_IObject,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)pDstTexture[0x16].super_IDeviceObject.super_IObject._vptr_IObject,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,(VkImageResolve *)local_a0);
  return;
}

Assistant:

void DeviceContextVkImpl::ResolveTextureSubresource(ITexture*                               pSrcTexture,
                                                    ITexture*                               pDstTexture,
                                                    const ResolveTextureSubresourceAttribs& ResolveAttribs)
{
    TDeviceContextBase::ResolveTextureSubresource(pSrcTexture, pDstTexture, ResolveAttribs);

    TextureVkImpl*     pSrcTexVk  = ClassPtrCast<TextureVkImpl>(pSrcTexture);
    TextureVkImpl*     pDstTexVk  = ClassPtrCast<TextureVkImpl>(pDstTexture);
    const TextureDesc& SrcTexDesc = pSrcTexVk->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexVk->GetDesc();

    DEV_CHECK_ERR(SrcTexDesc.Format == DstTexDesc.Format, "Vulkan requires that source and destination textures of a resolve operation "
                                                          "have the same format (18.6)");
    (void)DstTexDesc;

    EnsureVkCmdBuffer();
    // srcImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.6)
    TransitionOrVerifyTextureState(*pSrcTexVk, ResolveAttribs.SrcTextureTransitionMode, RESOURCE_STATE_RESOLVE_SOURCE, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                   "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");

    // dstImageLayout must be VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL or VK_IMAGE_LAYOUT_GENERAL (18.6)
    TransitionOrVerifyTextureState(*pDstTexVk, ResolveAttribs.DstTextureTransitionMode, RESOURCE_STATE_RESOLVE_DEST, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                   "Resolving multi-sampled texture (DeviceContextVkImpl::ResolveTextureSubresource)");

    const TextureFormatAttribs& ResolveFmtAttribs = GetTextureFormatAttribs(SrcTexDesc.Format);
    DEV_CHECK_ERR(ResolveFmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH && ResolveFmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL,
                  "Vulkan only allows resolve operation for color formats");
    (void)ResolveFmtAttribs;
    // The aspectMask member of srcSubresource and dstSubresource must only contain VK_IMAGE_ASPECT_COLOR_BIT (18.6)
    VkImageAspectFlags aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;

    VkImageResolve ResolveRegion;
    ResolveRegion.srcSubresource.baseArrayLayer = ResolveAttribs.SrcSlice;
    ResolveRegion.srcSubresource.layerCount     = 1;
    ResolveRegion.srcSubresource.mipLevel       = ResolveAttribs.SrcMipLevel;
    ResolveRegion.srcSubresource.aspectMask     = aspectMask;

    ResolveRegion.dstSubresource.baseArrayLayer = ResolveAttribs.DstSlice;
    ResolveRegion.dstSubresource.layerCount     = 1;
    ResolveRegion.dstSubresource.mipLevel       = ResolveAttribs.DstMipLevel;
    ResolveRegion.dstSubresource.aspectMask     = aspectMask;

    ResolveRegion.srcOffset              = VkOffset3D{};
    ResolveRegion.dstOffset              = VkOffset3D{};
    const MipLevelProperties& MipAttribs = GetMipLevelProperties(SrcTexDesc, ResolveAttribs.SrcMipLevel);
    ResolveRegion.extent                 = VkExtent3D{
        static_cast<uint32_t>(MipAttribs.LogicalWidth),
        static_cast<uint32_t>(MipAttribs.LogicalHeight),
        static_cast<uint32_t>(MipAttribs.Depth)};

    m_CommandBuffer.ResolveImage(pSrcTexVk->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
                                 pDstTexVk->GetVkImage(), VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
                                 1, &ResolveRegion);
}